

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

_Bool check_buffer_below_thresh(AV1_COMP *cpi,int64_t buffer_level,int drop_mark)

{
  int iVar1;
  undefined1 auVar2 [16];
  long lVar3;
  int iVar4;
  long *plVar5;
  
  if (((cpi->ppi->use_svc != 0) && (iVar4 = (cpi->svc).number_spatial_layers, iVar4 != 1)) &&
     ((cpi->svc).framedrop_mode != AOM_LAYER_DROP)) {
    iVar1 = (cpi->svc).spatial_layer_id;
    if (iVar1 < iVar4) {
      lVar3 = (long)(cpi->svc).number_temporal_layers;
      plVar5 = (long *)((long)(cpi->svc).layer_context[(cpi->svc).temporal_layer_id].p_rc.
                              avg_frame_qindex + (long)iVar1 * lVar3 * 0x3380 + -0x44);
      iVar4 = iVar4 - iVar1;
      do {
        if ((0 < plVar5[0x215]) &&
           (auVar2 = SEXT816((long)(cpi->oxcf).rc_cfg.drop_frames_water_mark * *plVar5) *
                     ZEXT816(0xa3d70a3d70a3d70b),
           plVar5[0x18] <= (long)((int)(auVar2._8_8_ >> 6) - (auVar2._12_4_ >> 0x1f)))) {
          return true;
        }
        plVar5 = plVar5 + lVar3 * 0x670;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
    }
    return false;
  }
  return buffer_level <= drop_mark;
}

Assistant:

static bool check_buffer_below_thresh(AV1_COMP *cpi, int64_t buffer_level,
                                      int drop_mark) {
  SVC *svc = &cpi->svc;
  if (!cpi->ppi->use_svc || cpi->svc.number_spatial_layers == 1 ||
      cpi->svc.framedrop_mode == AOM_LAYER_DROP) {
    return (buffer_level <= drop_mark);
  } else {
    // For SVC in the AOM_FULL_SUPERFRAME_DROP): the condition on
    // buffer is checked on current and upper spatial layers.
    for (int i = svc->spatial_layer_id; i < svc->number_spatial_layers; ++i) {
      const int layer = LAYER_IDS_TO_IDX(i, svc->temporal_layer_id,
                                         svc->number_temporal_layers);
      LAYER_CONTEXT *lc = &svc->layer_context[layer];
      PRIMARY_RATE_CONTROL *lrc = &lc->p_rc;
      // Exclude check for layer whose bitrate is 0.
      if (lc->target_bandwidth > 0) {
        const int drop_thresh = cpi->oxcf.rc_cfg.drop_frames_water_mark;
        const int drop_mark_layer =
            (int)(drop_thresh * lrc->optimal_buffer_level / 100);
        if (lrc->buffer_level <= drop_mark_layer) return true;
      }
    }
    return false;
  }
}